

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

_Bool ipv4_normalize(char *hostname,char *outp,size_t olen)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  _Bool _Var5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  unsigned_long parts [4];
  char *endp;
  ulong local_58 [4];
  char *local_38;
  
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  bVar4 = false;
  iVar8 = 0;
  do {
    if (bVar4) {
      _Var5 = true;
      uVar2 = local_58[0];
      uVar6 = local_58[1];
      switch(iVar8) {
      case 0:
        uVar3 = local_58[0] & 0xff;
        uVar2 = local_58[0] >> 0x18;
        uVar6 = (ulong)((uint)(local_58[0] >> 0x10) & 0xff);
        uVar7 = (ulong)((uint)(local_58[0] >> 8) & 0xff);
        goto LAB_00528e68;
      case 1:
        if (0xffffff < local_58[1] || 0xff < local_58[0]) goto LAB_00528e54;
        uVar6 = local_58[1] >> 0x10;
        uVar7 = local_58[1] >> 8 & 0xff;
        uVar3 = local_58[1];
        break;
      case 2:
        if (0xffff < local_58[2] || (0xff < local_58[1] || 0xff < local_58[0])) goto LAB_00528e54;
        uVar7 = local_58[2] >> 8;
        uVar3 = local_58[2];
        break;
      case 3:
        uVar3 = local_58[3];
        uVar7 = local_58[2];
        if ((local_58[3] < 0x100 && local_58[2] < 0x100) &&
            (local_58[1] < 0x100 && local_58[0] < 0x100)) goto LAB_00528e68;
        goto LAB_00528e54;
      default:
        goto switchD_00528d8a_default;
      }
      uVar3 = uVar3 & 0xff;
LAB_00528e68:
      curl_msnprintf(outp,0x11,"%u.%u.%u.%u",uVar2,uVar6,uVar7,uVar3);
      return true;
    }
    if ((byte)(*hostname - 0x3aU) < 0xf6) {
LAB_00528d21:
      bVar1 = false;
    }
    else {
      bVar1 = false;
      uVar2 = strtoul(hostname,&local_38,0);
      if (uVar2 != 0xffffffffffffffff) {
        if (uVar2 >> 0x20 != 0 || local_38 == hostname) goto LAB_00528d21;
        local_58[iVar8] = uVar2;
        hostname = local_38;
        if (*local_38 == '\0') {
          bVar4 = true;
          bVar1 = true;
        }
        else {
          if (*local_38 == '.') {
            if (iVar8 != 3) {
              iVar8 = iVar8 + 1;
              hostname = local_38 + 1;
              bVar1 = true;
              goto LAB_00528d24;
            }
            iVar8 = 3;
          }
          bVar1 = false;
        }
      }
    }
LAB_00528d24:
  } while (bVar1);
LAB_00528e54:
  _Var5 = false;
switchD_00528d8a_default:
  return _Var5;
}

Assistant:

static bool ipv4_normalize(const char *hostname, char *outp, size_t olen)
{
  bool done = FALSE;
  int n = 0;
  const char *c = hostname;
  unsigned long parts[4] = {0, 0, 0, 0};

  while(!done) {
    char *endp;
    unsigned long l;
    if((*c < '0') || (*c > '9'))
      /* most importantly this doesn't allow a leading plus or minus */
      return FALSE;
    l = strtoul(c, &endp, 0);

    /* overflow or nothing parsed at all */
    if(((l == ULONG_MAX) && (errno == ERANGE)) ||  (endp == c))
      return FALSE;

#if SIZEOF_LONG > 4
    /* a value larger than 32 bits */
    if(l > UINT_MAX)
      return FALSE;
#endif

    parts[n] = l;
    c = endp;

    switch (*c) {
    case '.' :
      if(n == 3)
        return FALSE;
      n++;
      c++;
      break;

    case '\0':
      done = TRUE;
      break;

    default:
      return FALSE;
    }
  }

  /* this is deemed a valid IPv4 numerical address */

  switch(n) {
  case 0: /* a -- 32 bits */
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0] >> 24, (parts[0] >> 16) & 0xff,
              (parts[0] >> 8) & 0xff, parts[0] & 0xff);
    break;
  case 1: /* a.b -- 8.24 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xffffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], (parts[1] >> 16) & 0xff,
              (parts[1] >> 8) & 0xff, parts[1] & 0xff);
    break;
  case 2: /* a.b.c -- 8.8.16 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xffff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], (parts[2] >> 8) & 0xff,
              parts[2] & 0xff);
    break;
  case 3: /* a.b.c.d -- 8.8.8.8 bits */
    if((parts[0] > 0xff) || (parts[1] > 0xff) || (parts[2] > 0xff) ||
       (parts[3] > 0xff))
      return FALSE;
    msnprintf(outp, olen, "%u.%u.%u.%u",
              parts[0], parts[1], parts[2], parts[3]);
    break;
  }
  return TRUE;
}